

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Bundle::SetPDUs
          (Bundle *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
          *P)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
  *local_18;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
  *P_local;
  Bundle *this_local;
  
  local_18 = P;
  P_local = (vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
             *)this;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
  ::operator=(&this->m_vRefHeaders,P);
  calculateLength(this);
  if (0x2000 < this->m_ui16Length) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SetPDUs",&local_39);
    KException::KException(this_00,&local_38,0xb);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  return;
}

Assistant:

void Bundle::SetPDUs(const vector<PduPtr> &P) noexcept(false)
{
    m_vRefHeaders = P;
    calculateLength();
    if( m_ui16Length > MAX_PDU_SIZE )throw KException( __FUNCTION__, PDU_TOO_LARGE );
}